

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

cio_error write_ping_or_pong_message
                    (cio_websocket *websocket,cio_websocket_frame_type frame_type,
                    cio_websocket_write_job *job,cio_write_buffer *payload,
                    cio_websocket_write_handler_t handler,void *handler_context)

{
  int iVar1;
  size_t length_00;
  size_t length;
  void *handler_context_local;
  cio_websocket_write_handler_t handler_local;
  cio_write_buffer *payload_local;
  cio_websocket_write_job *job_local;
  cio_websocket_frame_type frame_type_local;
  cio_websocket *websocket_local;
  
  if (handler == (cio_websocket_write_handler_t)0x0) {
    websocket_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    iVar1 = payload_size_in_limit(payload,0x7d);
    if (iVar1 == 0) {
      websocket_local._4_4_ = CIO_INVALID_ARGUMENT;
    }
    else if (job->wbh == (cio_write_buffer *)0x0) {
      job->wbh = payload;
      job->handler = handler;
      job->handler_context = handler_context;
      job->frame_type = frame_type;
      job->last_frame = true;
      job->stream_handler = message_written;
      length_00 = cio_write_buffer_get_total_size(payload);
      enqueue_job(websocket,job,length_00);
      websocket_local._4_4_ = CIO_SUCCESS;
    }
    else {
      websocket_local._4_4_ = CIO_OPERATION_NOT_PERMITTED;
    }
  }
  return websocket_local._4_4_;
}

Assistant:

static enum cio_error write_ping_or_pong_message(struct cio_websocket *websocket, enum cio_websocket_frame_type frame_type, struct cio_websocket_write_job *job, struct cio_write_buffer *payload, cio_websocket_write_handler_t handler, void *handler_context)
{
	if (cio_unlikely(handler == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely(payload_size_in_limit(payload, CIO_WEBSOCKET_SMALL_FRAME_SIZE) == 0)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely(job->wbh != NULL)) {
		return CIO_OPERATION_NOT_PERMITTED;
	}

	job->wbh = payload;
	job->handler = handler;
	job->handler_context = handler_context;
	job->frame_type = frame_type;
	job->last_frame = true;
	job->stream_handler = message_written;

	size_t length = cio_write_buffer_get_total_size(payload);
	enqueue_job(websocket, job, length);
	return CIO_SUCCESS;
}